

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

string * anon_unknown.dwarf_48c61e::ToNativePath(string *__return_storage_ptr__,string *path)

{
  string *psVar1;
  ulong uVar2;
  char *pcVar3;
  string local_40;
  string *local_20;
  string *outPath;
  string *path_local;
  
  outPath = path;
  path_local = __return_storage_ptr__;
  cmSystemTools::ConvertToOutputPath(&local_40,path);
  local_20 = &local_40;
  uVar2 = std::__cxx11::string::size();
  if (1 < uVar2) {
    pcVar3 = (char *)std::__cxx11::string::front();
    if (*pcVar3 == '\"') {
      pcVar3 = (char *)std::__cxx11::string::back();
      psVar1 = local_20;
      if (*pcVar3 == '\"') {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar1);
        goto LAB_003469ff;
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
LAB_003469ff:
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ToNativePath(const std::string& path)
{
  const auto& outPath = cmSystemTools::ConvertToOutputPath(path);
  if (outPath.size() > 1 && outPath.front() == '\"' &&
      outPath.back() == '\"') {
    return outPath.substr(1, outPath.size() - 2);
  }
  return outPath;
}